

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

Abc_Des_t * Ver_ParseFile(char *pFileName,Abc_Des_t *pGateLib,int fCheck,int fUseMemMan)

{
  Abc_Des_t *pAVar1;
  Ver_Man_t *pMan;
  Abc_Des_t *pDesign;
  Ver_Man_t *p;
  int fUseMemMan_local;
  int fCheck_local;
  Abc_Des_t *pGateLib_local;
  char *pFileName_local;
  
  pMan = Ver_ParseStart(pFileName,pGateLib);
  pMan->fMapped = glo_fMapped;
  pMan->fCheck = fCheck;
  pMan->fUseMemMan = fUseMemMan;
  if (glo_fMapped != 0) {
    Hop_ManStop((Hop_Man_t *)pMan->pDesign->pManFunc);
    pMan->pDesign->pManFunc = (void *)0x0;
  }
  Ver_ParseInternal(pMan);
  pAVar1 = pMan->pDesign;
  pMan->pDesign = (Abc_Des_t *)0x0;
  Ver_ParseStop(pMan);
  return pAVar1;
}

Assistant:

Abc_Des_t * Ver_ParseFile( char * pFileName, Abc_Des_t * pGateLib, int fCheck, int fUseMemMan )
{
    Ver_Man_t * p;
    Abc_Des_t * pDesign;
    // start the parser
    p = Ver_ParseStart( pFileName, pGateLib );
    p->fMapped    = glo_fMapped;
    p->fCheck     = fCheck;
    p->fUseMemMan = fUseMemMan;
    if ( glo_fMapped )
    {
        Hop_ManStop((Hop_Man_t *)p->pDesign->pManFunc);
        p->pDesign->pManFunc = NULL;
    }
    // parse the file
    Ver_ParseInternal( p );
    // save the result
    pDesign = p->pDesign;
    p->pDesign = NULL;
    // stop the parser
    Ver_ParseStop( p );
    return pDesign;
}